

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O1

boolean set_quant_slots(j_compress_ptr cinfo,char *arg)

{
  char cVar1;
  uint in_EAX;
  int iVar2;
  long lVar3;
  char ch;
  int val;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  lVar3 = 0;
  do {
    if (*arg == '\0') {
      cinfo->comp_info[lVar3].quant_tbl_no = uStack_38._4_4_;
    }
    else {
      uStack_38._0_4_ = CONCAT13(0x2c,(undefined3)uStack_38);
      iVar2 = __isoc99_sscanf(arg,"%d%c",(long)&uStack_38 + 4,(long)&uStack_38 + 3);
      if (iVar2 < 1) {
        return 0;
      }
      if (uStack_38._3_1_ != ',') {
        return 0;
      }
      if (3 < uStack_38._4_4_) {
        set_quant_slots_cold_1();
        return 0;
      }
      cinfo->comp_info[lVar3].quant_tbl_no = uStack_38._4_4_;
      do {
        cVar1 = *arg;
        if (cVar1 == '\0') break;
        arg = arg + 1;
      } while (cVar1 != ',');
    }
    lVar3 = lVar3 + 1;
    if (lVar3 == 10) {
      return 1;
    }
  } while( true );
}

Assistant:

GLOBAL(boolean)
set_quant_slots(j_compress_ptr cinfo, char *arg)
/* Process a quantization-table-selectors parameter string, of the form
 *     N[,N,...]
 * If there are more components than parameters, the last value is replicated.
 */
{
  int val = 0;                  /* default table # */
  int ci;
  char ch;

  for (ci = 0; ci < MAX_COMPONENTS; ci++) {
    if (*arg) {
      ch = ',';                 /* if not set by sscanf, will be ',' */
      if (sscanf(arg, "%d%c", &val, &ch) < 1)
        return FALSE;
      if (ch != ',')            /* syntax check */
        return FALSE;
      if (val < 0 || val >= NUM_QUANT_TBLS) {
        fprintf(stderr, "JPEG quantization tables are numbered 0..%d\n",
                NUM_QUANT_TBLS - 1);
        return FALSE;
      }
      cinfo->comp_info[ci].quant_tbl_no = val;
      while (*arg && *arg++ != ','); /* advance to next segment of arg
                                        string */
    } else {
      /* reached end of parameter, set remaining components to last table */
      cinfo->comp_info[ci].quant_tbl_no = val;
    }
  }
  return TRUE;
}